

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MidiPlayerDialog.cpp
# Opt level: O0

void __thiscall
MidiPlayerDialog::handlePlaybackTimeChanged
          (MidiPlayerDialog *this,quint64 currentNanos,quint32 totalSeconds)

{
  byte bVar1;
  uint uVar2;
  QString local_a0;
  QString local_88;
  QString local_70;
  QString local_58;
  undefined1 local_40 [8];
  QString pos;
  QChar z;
  quint32 currentSeconds;
  quint32 totalSeconds_local;
  quint64 currentNanos_local;
  MidiPlayerDialog *this_local;
  
  uVar2 = (uint)(currentNanos / 1000000000);
  QChar::QChar((QChar *)((long)&pos.d.size + 6),'0');
  QString::QString(&local_a0,"%1:%2 / %3:%4");
  QString::arg(&local_88,&local_a0,uVar2 / 0x3c,2,10,pos.d.size._6_2_);
  QString::arg(&local_70,&local_88,uVar2 % 0x3c,2,10,pos.d.size._6_2_);
  QString::arg(&local_58,&local_70,totalSeconds / 0x3c,2,10,pos.d.size._6_2_);
  QString::arg((QString *)local_40,&local_58,totalSeconds % 0x3c,2,10,pos.d.size._6_2_);
  QString::~QString(&local_58);
  QString::~QString(&local_70);
  QString::~QString(&local_88);
  QString::~QString(&local_a0);
  QLabel::setText(*(QString **)(this->ui + 0x68));
  bVar1 = QAbstractSlider::isSliderDown();
  if ((bVar1 & 1) == 0) {
    this->sliderUpdating = true;
    QAbstractSlider::setSliderPosition((int)*(undefined8 *)(this->ui + 0x70));
    this->sliderUpdating = false;
  }
  QString::~QString((QString *)local_40);
  return;
}

Assistant:

void MidiPlayerDialog::handlePlaybackTimeChanged(quint64 currentNanos, quint32 totalSeconds) {
	quint32 currentSeconds = currentNanos / MasterClock::NANOS_PER_SECOND;
	QChar z = QChar('0');
	QString pos = QString("%1:%2 / %3:%4").arg(currentSeconds / 60, 2, 10, z).arg(currentSeconds % 60, 2, 10, z).arg(totalSeconds / 60, 2, 10, z).arg(totalSeconds % 60, 2, 10, z);
	ui->positionLabel->setText(pos);
	if (!ui->positionSlider->isSliderDown()) {
		sliderUpdating = true;
		ui->positionSlider->setSliderPosition((totalSeconds != 0) ? currentNanos / MasterClock::NANOS_PER_MILLISECOND / totalSeconds : 0);
		sliderUpdating = false;
	}
}